

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

ssize_t __thiscall
duckdb_parquet::BloomFilterHeader::write(BloomFilterHeader *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ssize_t sVar13;
  ssize_t sVar14;
  ssize_t sVar15;
  size_t sVar16;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar1 = (*this_00->_vptr_TProtocol[4])(this_00,"BloomFilterHeader");
  iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"numBytes",8,1);
  iVar3 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)(uint)this->numBytes);
  iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
  sVar16 = 2;
  iVar5 = (*this_00->_vptr_TProtocol[6])(this_00,"algorithm",0xc);
  sVar13 = BloomFilterAlgorithm::write(&this->algorithm,__fd,__buf_00,sVar16);
  iVar6 = (*this_00->_vptr_TProtocol[7])(this_00);
  sVar16 = 3;
  iVar7 = (*this_00->_vptr_TProtocol[6])(this_00,"hash",0xc);
  sVar14 = BloomFilterHash::write(&this->hash,__fd,__buf_01,sVar16);
  iVar8 = (*this_00->_vptr_TProtocol[7])(this_00);
  sVar16 = 4;
  iVar9 = (*this_00->_vptr_TProtocol[6])(this_00,"compression",0xc);
  sVar15 = BloomFilterCompression::write(&this->compression,__fd,__buf_02,sVar16);
  iVar10 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar11 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar12 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)((int)sVar15 + iVar10 + iVar11 + iVar12 +
                      iVar7 + (int)sVar14 + iVar8 + iVar9 +
                      iVar5 + (int)sVar13 + iVar6 + iVar3 + iVar4 + iVar2 + iVar1);
}

Assistant:

uint32_t BloomFilterHeader::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("BloomFilterHeader");

  xfer += oprot->writeFieldBegin("numBytes", ::apache::thrift::protocol::T_I32, 1);
  xfer += oprot->writeI32(this->numBytes);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("algorithm", ::apache::thrift::protocol::T_STRUCT, 2);
  xfer += this->algorithm.write(oprot);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("hash", ::apache::thrift::protocol::T_STRUCT, 3);
  xfer += this->hash.write(oprot);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("compression", ::apache::thrift::protocol::T_STRUCT, 4);
  xfer += this->compression.write(oprot);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}